

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O0

ModelPtr createModelWithComponent(string *modelName,string *componentName)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ModelPtr MVar2;
  shared_ptr<libcellml::Component> local_48 [2];
  undefined1 local_21;
  string *componentName_local;
  string *modelName_local;
  ModelPtr *model;
  
  local_21 = 0;
  componentName_local = componentName;
  modelName_local = modelName;
  libcellml::Model::create();
  peVar1 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)modelName);
  libcellml::NamedEntity::setName((string *)peVar1);
  createComponentInModel((ModelPtr *)local_48,modelName);
  std::shared_ptr<libcellml::Component>::~shared_ptr(local_48);
  MVar2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)modelName;
  return (ModelPtr)MVar2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

libcellml::ModelPtr createModelWithComponent(const std::string &modelName, const std::string &componentName)
{
    libcellml::ModelPtr model = libcellml::Model::create();
    model->setName(modelName);
    createComponentInModel(model, componentName);
    return model;
}